

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  code *pcVar11;
  bool bVar12;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  secp256k1_modinv64_signed62 x;
  uint16_t negone [16];
  
  uint16_to_signed62(&x,in);
  uint16_to_signed62(&m.modulus,mod);
  uVar6 = modinv2p64(m.modulus.v[0]);
  m.modulus_inv62 = uVar6 & 0x3fffffffffffffff;
  if ((m.modulus.v[0] * uVar6 & 0x3fffffffffffffff) != 1) {
    pcVar10 = "test condition failed: ((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1";
    uVar9 = 0x3cd;
    goto LAB_0012e877;
  }
  if (((x.v[3] != 0 || x.v[1] != 0) || (x.v[2] != 0 || x.v[0] != 0)) || x.v[4] != 0) {
    mulmod256(tmp,in,in,mod);
    uint16_to_signed62(&x,tmp);
    uVar4 = secp256k1_jacobi64_maybe_var(&x,&m);
    if (1 < uVar4) {
      pcVar10 = "test condition failed: jac == 0 || jac == 1";
      uVar9 = 0x3d7;
      goto LAB_0012e877;
    }
    negone[0] = *mod - 1;
    for (lVar7 = 1; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      negone[lVar7] = mod[lVar7];
    }
    mulmod256(tmp,tmp,negone,mod);
    uint16_to_signed62(&x,tmp);
    iVar5 = secp256k1_jacobi64_maybe_var(&x,&m);
    if ((iVar5 != 0) && (iVar5 != 1 - (*mod & 2))) {
      pcVar10 = "test condition failed: jac == 0 || jac == 1 - (mod[0] & 2)";
      uVar9 = 0x3df;
      goto LAB_0012e877;
    }
  }
  uint16_to_signed62(&x,in);
  iVar5 = 8;
  while (bVar12 = iVar5 != 0, iVar5 = iVar5 + -1, bVar12) {
    uVar6 = testrand64();
    uVar8 = uVar6 >> 0x3e;
    lVar7 = m.modulus.v[uVar8];
    if (lVar7 < 1) {
      if ((lVar7 < 0) && (lVar3 = m.modulus.v[uVar8 + 1], -0x4000000000000000 < lVar3)) {
        m.modulus.v[uVar8] = lVar7 + 0x4000000000000000;
        m.modulus.v[uVar8 + 1] = lVar3 + -1;
      }
    }
    else {
      lVar3 = m.modulus.v[uVar8 + 1];
      if (lVar3 < 0x4000000000000000) {
        m.modulus.v[uVar8] = lVar7 + -0x4000000000000000;
        m.modulus.v[uVar8 + 1] = lVar3 + 1;
      }
    }
  }
  iVar5 = 0;
  while( true ) {
    if (iVar5 == 2) {
      return;
    }
    pcVar11 = secp256k1_modinv64_var;
    if (iVar5 == 0) {
      pcVar11 = secp256k1_modinv64;
    }
    (*pcVar11)(&x,&m);
    signed62_to_uint16(out,&x);
    mulmod256(tmp,out,in,mod);
    if (tmp[0] != (((x.v[3] != 0 || x.v[1] != 0) || (x.v[2] != 0 || x.v[0] != 0)) || x.v[4] != 0))
    break;
    lVar7 = 1;
    while (lVar7 != 0x10) {
      puVar1 = tmp + lVar7;
      lVar7 = lVar7 + 1;
      if (*puVar1 != 0) {
        pcVar10 = "test condition failed: tmp[i] == 0";
        uVar9 = 0x3ee;
        goto LAB_0012e877;
      }
    }
    (*pcVar11)(&x,&m);
    signed62_to_uint16(tmp,&x);
    lVar7 = 0;
    while (lVar7 != 0x10) {
      puVar2 = tmp + lVar7;
      puVar1 = in + lVar7;
      lVar7 = lVar7 + 1;
      if (*puVar2 != *puVar1) {
        pcVar10 = "test condition failed: tmp[i] == in[i]";
        uVar9 = 0x3f5;
        goto LAB_0012e877;
      }
    }
    iVar5 = iVar5 + 1;
  }
  pcVar10 = "test condition failed: tmp[0] == nonzero";
  uVar9 = 0x3ed;
LAB_0012e877:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar9,pcVar10);
  abort();
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}